

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetConstantFromInst
          (ConstantManager *this,Instruction *inst)

{
  uint **ppuVar1;
  uint *puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  pointer puVar4;
  Operand *pOVar5;
  uint **ppuVar6;
  ulong uVar7;
  Type *type;
  Constant *pCVar8;
  pointer puVar9;
  uint uVar10;
  uint32_t index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literal_words_or_ids;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  uVar10 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar10 = (uint)inst->has_result_id_;
  }
  if (uVar10 != (int)((ulong)((long)(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    index = 0;
    do {
      puVar4 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pOVar5 = Instruction::GetInOperand(inst,index);
      ppuVar1 = (uint **)(pOVar5->words).large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl;
      ppuVar6 = &(pOVar5->words).small_data_;
      if (ppuVar1 != (uint **)0x0) {
        ppuVar6 = ppuVar1;
      }
      puVar2 = *ppuVar6;
      pOVar5 = Instruction::GetInOperand(inst,index);
      pvVar3 = (pOVar5->words).large_data_._M_t.
               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl;
      if (pvVar3 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        puVar9 = (pOVar5->words).small_data_ + (pOVar5->words).size_;
      }
      else {
        puVar9 = *(pointer *)
                  ((long)&(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl + 8);
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_insert<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,puVar4,puVar2,puVar9
                );
      index = index + 1;
      uVar10 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar10 = (uint)inst->has_result_id_;
      }
    } while (index < (int)((ulong)((long)(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar10);
  }
  uVar7 = (ulong)inst->opcode_;
  pCVar8 = (Constant *)0x0;
  if (0x33 < uVar7) goto LAB_001df148;
  if ((0x8580000000000U >> (uVar7 & 0x3f) & 1) == 0) {
    if (uVar7 == 0x29) {
      local_4c = 1;
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
LAB_001df11b:
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_4c);
        goto LAB_001df12a;
      }
      *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
    }
    else {
      if (uVar7 != 0x2a) goto LAB_001df148;
      local_4c = 0;
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) goto LAB_001df11b;
      *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
    }
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
LAB_001df12a:
  type = GetType(this,inst);
  pCVar8 = GetConstant(this,type,&local_48);
LAB_001df148:
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pCVar8;
}

Assistant:

const Constant* ConstantManager::GetConstantFromInst(const Instruction* inst) {
  std::vector<uint32_t> literal_words_or_ids;

  // Collect the constant defining literals or component ids.
  for (uint32_t i = 0; i < inst->NumInOperands(); i++) {
    literal_words_or_ids.insert(literal_words_or_ids.end(),
                                inst->GetInOperand(i).words.begin(),
                                inst->GetInOperand(i).words.end());
  }

  switch (inst->opcode()) {
    // OpConstant{True|False} have the value embedded in the opcode. So they
    // are not handled by the for-loop above. Here we add the value explicitly.
    case spv::Op::OpConstantTrue:
      literal_words_or_ids.push_back(true);
      break;
    case spv::Op::OpConstantFalse:
      literal_words_or_ids.push_back(false);
      break;
    case spv::Op::OpConstantNull:
    case spv::Op::OpConstant:
    case spv::Op::OpConstantComposite:
    case spv::Op::OpSpecConstantComposite:
      break;
    default:
      return nullptr;
  }

  return GetConstant(GetType(inst), literal_words_or_ids);
}